

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O0

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall CriticalSection::unlocks(CriticalSection *this)

{
  bool bVar1;
  CallInst *this_00;
  LockNode *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_llvm::CallInst_*>,_bool> pVar2;
  UnlockNode *unlock;
  iterator __end1;
  iterator __begin1;
  set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *__range1;
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  *llvmUnlocks;
  LockNode *this_01;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  _Self local_60;
  _Self local_58;
  undefined1 local_50 [48];
  undefined1 *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  ::set((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
         *)0x1af65d);
  LockNode::correspondingUnlocks(in_RDI);
  local_20 = local_50;
  local_58._M_node =
       (_Base_ptr)
       std::set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>::begin
                 ((set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)
                  in_RDI);
  local_60._M_node =
       (_Base_ptr)
       std::set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>::end
                 ((set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)
                  in_RDI);
  while (bVar1 = std::operator!=(&local_58,&local_60), bVar1) {
    std::_Rb_tree_const_iterator<UnlockNode_*>::operator*
              ((_Rb_tree_const_iterator<UnlockNode_*> *)0x1af6c0);
    this_00 = Node::callInstruction(&in_RDI->super_Node);
    pVar2 = std::
            set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
            ::insert((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
                      *)this_00,
                     (value_type *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88));
    in_stack_ffffffffffffff88 = pVar2.second;
    std::_Rb_tree_const_iterator<UnlockNode_*>::operator++
              ((_Rb_tree_const_iterator<UnlockNode_*> *)this_01);
  }
  std::set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>::~set
            ((set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)0x1af6b4);
  return (set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
          *)this_01;
}

Assistant:

std::set<const llvm::CallInst *> CriticalSection::unlocks() const {
    std::set<const llvm::CallInst *> llvmUnlocks;
    for (auto *unlock : lock_->correspondingUnlocks()) {
        llvmUnlocks.insert(unlock->callInstruction());
    }
    return llvmUnlocks;
}